

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::NormalizeFindResult(cmFindBase *this)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *__rhs;
  cmake *pcVar3;
  string *psVar4;
  pointer pcVar5;
  size_type sVar6;
  cmMakefile *pcVar7;
  string_view value_00;
  string_view value_01;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  path local_e8;
  path local_c0;
  path local_98;
  path local_70;
  string local_48;
  
  PVar2 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  if (PVar2 != NEW) {
    if (this->StoreResultInCache == true) {
      if (this->AlreadyInCacheWithoutMetaInfo != true) {
        return;
      }
      psVar4 = &this->VariableName;
      cmMakefile::AddCacheDefinition
                ((this->super_cmFindCommon).Makefile,psVar4,"",
                 (this->VariableDocumentation)._M_dataplus._M_p,this->VariableType,false);
      PVar2 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
      if (PVar2 != NEW) {
        return;
      }
      bVar1 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar4);
      if (!bVar1) {
        return;
      }
      pcVar7 = (this->super_cmFindCommon).Makefile;
      pcVar3 = cmMakefile::GetCMakeInstance(pcVar7);
      psVar4 = (string *)cmake::GetCacheDefinition(pcVar3,psVar4);
      if (psVar4 == (string *)0x0) {
        psVar4 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar5 = (psVar4->_M_dataplus)._M_p;
      sVar6 = psVar4->_M_string_length;
    }
    else {
      pcVar7 = (this->super_cmFindCommon).Makefile;
      psVar4 = cmMakefile::GetSafeDefinition(pcVar7,&this->VariableName);
      pcVar5 = (psVar4->_M_dataplus)._M_p;
      sVar6 = psVar4->_M_string_length;
    }
    value_01._M_str = pcVar5;
    value_01._M_len = sVar6;
    cmMakefile::AddDefinition(pcVar7,&this->VariableName,value_01);
    return;
  }
  psVar4 = &this->VariableName;
  __rhs = (string *)cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,psVar4);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  if (__rhs == (string *)0x0) {
    __rhs = &cmValue::Empty_abi_cxx11_;
  }
  if (__rhs->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_108,(string *)__rhs);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_c0,&local_108,auto_format);
    pcVar3 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
    std::__cxx11::string::string((string *)&local_128,(string *)&pcVar3->CMakeWorkingDirectory);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_e8,&local_128,generic_format);
    cmCMakePath::Absolute((cmCMakePath *)&local_98,(cmCMakePath *)&local_c0,&local_e8);
    cmCMakePath::Normal((cmCMakePath *)&local_70,(cmCMakePath *)&local_98);
    std::filesystem::__cxx11::path::generic_string(&local_48,&local_70);
    std::__cxx11::string::operator=((string *)&value,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::filesystem::__cxx11::path::~path(&local_70);
    std::filesystem::__cxx11::path::~path(&local_98);
    std::filesystem::__cxx11::path::~path(&local_e8);
    std::__cxx11::string::~string((string *)&local_128);
    std::filesystem::__cxx11::path::~path(&local_c0);
    std::__cxx11::string::~string((string *)&local_108);
    bVar1 = cmsys::SystemTools::FileExists(&value,false);
    if (!bVar1) {
      std::__cxx11::string::_M_assign((string *)&value);
    }
  }
  if (this->StoreResultInCache == true) {
    bVar1 = std::operator!=(&value,__rhs);
    if ((!bVar1) && (this->AlreadyInCacheWithoutMetaInfo != true)) goto LAB_003ea1b5;
    pcVar3 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
    cmake::AddCacheEntry
              (pcVar3,psVar4,&value,(this->VariableDocumentation)._M_dataplus._M_p,
               this->VariableType);
    PVar2 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
    pcVar7 = (this->super_cmFindCommon).Makefile;
    if (PVar2 != NEW) {
      cmMakefile::RemoveDefinition(pcVar7,psVar4);
      goto LAB_003ea1b5;
    }
    bVar1 = cmMakefile::IsNormalDefinitionSet(pcVar7,psVar4);
    if (!bVar1) goto LAB_003ea1b5;
  }
  value_00._M_str = value._M_dataplus._M_p;
  value_00._M_len = value._M_string_length;
  cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,psVar4,value_00);
LAB_003ea1b5:
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void cmFindBase::NormalizeFindResult()
{
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) ==
      cmPolicies::NEW) {
    // ensure the path returned by find_* command is absolute
    const auto& existingValue =
      this->Makefile->GetDefinition(this->VariableName);
    std::string value;
    if (!existingValue->empty()) {
      value =
        cmCMakePath(*existingValue, cmCMakePath::auto_format)
          .Absolute(cmCMakePath(
            this->Makefile->GetCMakeInstance()->GetCMakeWorkingDirectory()))
          .Normal()
          .GenericString();
      // value = cmSystemTools::CollapseFullPath(*existingValue);
      if (!cmSystemTools::FileExists(value, false)) {
        value = *existingValue;
      }
    }

    if (this->StoreResultInCache) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the original
      // value.
      if (value != *existingValue || this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->GetCMakeInstance()->AddCacheEntry(
          this->VariableName, value, this->VariableDocumentation.c_str(),
          this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
            cmPolicies::NEW) {
          if (this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
            this->Makefile->AddDefinition(this->VariableName, value);
          }
        } else {
          // if there was a definition then remove it
          // This is required to ensure same behavior as
          // cmMakefile::AddCacheDefinition.
          this->Makefile->RemoveDefinition(this->VariableName);
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(this->VariableName, value);
    }
  } else {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->StoreResultInCache) {
      if (this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->AddCacheDefinition(this->VariableName, "",
                                           this->VariableDocumentation.c_str(),
                                           this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
              cmPolicies::NEW &&
            this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
          this->Makefile->AddDefinition(
            this->VariableName,
            *this->Makefile->GetCMakeInstance()->GetCacheDefinition(
              this->VariableName));
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(
        this->VariableName,
        this->Makefile->GetSafeDefinition(this->VariableName));
    }
  }
}